

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse41_128_16.c
# Opt level: O0

parasail_result_t *
parasail_sw_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  unkbyte10 Var22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  short sVar44;
  short sVar45;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  ushort uVar46;
  ushort uVar47;
  short sVar48;
  ushort uVar53;
  ushort uVar54;
  short sVar55;
  uint uVar49;
  ushort uVar57;
  short sVar58;
  ushort uVar59;
  ushort uVar60;
  short sVar61;
  ulong uVar50;
  ulong uVar51;
  ushort uVar56;
  ushort uVar62;
  ushort uVar63;
  short sVar64;
  ushort uVar69;
  ushort uVar70;
  short sVar71;
  uint uVar65;
  ushort uVar72;
  undefined1 auVar52 [16];
  ushort uVar73;
  short sVar74;
  ushort uVar75;
  ushort uVar76;
  short sVar77;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  int local_b90;
  int local_b8c;
  int local_b78;
  int local_b74;
  int local_b60;
  int local_b5c;
  int local_b48;
  int local_b44;
  int local_b30;
  int local_b2c;
  int local_b18;
  int local_b14;
  int local_b00;
  int local_afc;
  int local_ae8;
  int local_ae4;
  int local_ab8;
  int local_ab4;
  longlong *plStack_ab0;
  int32_t k;
  int16_t *j_1;
  int16_t *i_1;
  int16_t *t;
  __m128i cond_Jlt;
  __m128i cond_all;
  __m128i cond_max;
  __m128i cond_eq;
  __m128i cond_valid_IJ;
  __m128i cond_valid_J;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  __m128i vIltLimit;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vJ;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vJLimit;
  __m128i vILimit;
  __m128i vEndJ;
  __m128i vEndI;
  __m128i vMaxH;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vN;
  __m128i vOne;
  __m128i vZero;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf0;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_82e;
  int iStack_828;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int16_t *F_pr;
  int16_t *H_pr;
  int16_t *s2;
  int16_t *_F_pr;
  int16_t *_H_pr;
  int16_t *s2B;
  int16_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  short local_528;
  short sStack_526;
  short sStack_524;
  short sStack_522;
  short sStack_520;
  short sStack_51e;
  short sStack_51c;
  short sStack_51a;
  short local_4c8;
  short sStack_4c6;
  short sStack_4c4;
  short sStack_4c2;
  short sStack_4c0;
  short sStack_4be;
  short sStack_4bc;
  short sStack_4ba;
  short local_4b8;
  short sStack_4b6;
  short sStack_4b4;
  short sStack_4b2;
  short sStack_4b0;
  short sStack_4ae;
  short sStack_4ac;
  short sStack_4aa;
  short local_4a8;
  short sStack_4a6;
  short sStack_4a4;
  short sStack_4a2;
  short sStack_4a0;
  short sStack_49e;
  short sStack_49c;
  short sStack_49a;
  short local_498;
  short sStack_496;
  short sStack_494;
  short sStack_492;
  short sStack_490;
  short sStack_48e;
  short sStack_48c;
  short sStack_48a;
  short local_488;
  short sStack_486;
  short sStack_484;
  short sStack_482;
  short sStack_480;
  short sStack_47e;
  short sStack_47c;
  short sStack_47a;
  short local_398;
  short sStack_396;
  short sStack_394;
  short sStack_392;
  short sStack_390;
  short sStack_38e;
  short sStack_38c;
  short sStack_38a;
  short local_368;
  short sStack_366;
  short sStack_364;
  short sStack_362;
  short sStack_360;
  short sStack_35e;
  short sStack_35c;
  short sStack_35a;
  uint uStack_354;
  uint uStack_34c;
  uint uStack_344;
  uint uStack_33c;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  
  s2B = (int16_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_diag_sse41_128_16","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_diag_sse41_128_16","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_diag_sse41_128_16","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_diag_sse41_128_16","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_diag_sse41_128_16","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_diag_sse41_128_16","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_diag_sse41_128_16","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_ab8 = _s1Len;
    if (matrix->type != 0) {
      local_ab8 = matrix->length;
    }
    _POS_LIMIT = 0;
    iStack_828 = 0;
    N._0_2_ = (short)open;
    sVar44 = (short)N;
    if (matrix->min <= -open) {
      sVar44 = -(short)matrix->min;
    }
    sVar44 = sVar44 + -0x7fff;
    sVar45 = ((ushort)matrix->max ^ 0x7fff) - 1;
    vNegInf[1] = CONCAT26(sVar44,CONCAT24(sVar44,CONCAT22(sVar44,sVar44)));
    vSaturationCheckMax[0] = CONCAT26(sVar44,CONCAT24(sVar44,CONCAT22(sVar44,sVar44)));
    vSaturationCheckMax[1] = CONCAT26(sVar45,CONCAT24(sVar45,CONCAT22(sVar45,sVar45)));
    vSaturationCheckMin[0] = CONCAT26(sVar45,CONCAT24(sVar45,CONCAT22(sVar45,sVar45)));
    uVar17 = CONCAT26(sVar44,CONCAT24(sVar44,CONCAT22(sVar44,sVar44)));
    uVar68 = CONCAT26(sVar44,CONCAT24(sVar44,CONCAT22(sVar44,sVar44)));
    auVar23._8_8_ = uVar68;
    auVar23._0_8_ = uVar17;
    uVar18 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    uVar20 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    PAD._0_2_ = (undefined2)gap;
    uVar19 = CONCAT26((undefined2)PAD,
                      CONCAT24((undefined2)PAD,CONCAT22((undefined2)PAD,(undefined2)PAD)));
    uVar21 = CONCAT26((undefined2)PAD,
                      CONCAT24((undefined2)PAD,CONCAT22((undefined2)PAD,(undefined2)PAD)));
    vI[0]._0_6_ = 0x100020003;
    vJreset[1] = 0x4000500060007;
    vI[0]._6_2_ = 0;
    vMaxH[0] = uVar68;
    vEndI[1] = uVar17;
    vEndI[0] = uVar68;
    vEndJ[1] = uVar17;
    vEndJ[0] = uVar68;
    vILimit[1] = uVar17;
    s2Len_PAD._0_2_ = (short)local_ab8;
    vILimit[0] = CONCAT26((short)s2Len_PAD,
                          CONCAT24((short)s2Len_PAD,CONCAT22((short)s2Len_PAD,(short)s2Len_PAD)));
    gap_local._0_2_ = (short)s2Len;
    _s1_local = (char *)parasail_result_new();
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x8201004;
      ptr = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_01 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      if (ptr == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          s2B = parasail_memalign_int16_t(0x10,(long)(local_ab8 + 7));
          if (s2B == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (end_query = 0; end_query < local_ab8; end_query = end_query + 1) {
            s2B[end_query] = (int16_t)matrix->mapper[(byte)_s1[end_query]];
          }
          for (end_query = local_ab8; end_query < local_ab8 + 7; end_query = end_query + 1) {
            s2B[end_query] = 0;
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 7] = (int16_t)matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -7; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 7] = 0;
        }
        while (end_ref = iVar1, end_ref < s2Len + 7) {
          ptr[(long)end_ref + 7] = 0;
          iVar1 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 7] = 0;
          ptr_01[(long)end_ref + 7] = sVar44;
        }
        for (end_ref = -7; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 7] = sVar44;
          ptr_01[(long)end_ref + 7] = sVar44;
        }
        while (end_ref = iVar1, end_ref < s2Len + 7) {
          ptr_00[(long)end_ref + 7] = sVar44;
          ptr_01[(long)end_ref + 7] = sVar44;
          iVar1 = end_ref + 1;
        }
        for (end_query = 0; end_query < local_ab8; end_query = end_query + 8) {
          vOpen[1] = auVar23._2_8_;
          vNegInf0[0] = uVar68 >> 0x10;
          vNH[0] = vNegInf0[0];
          vWH[1] = vOpen[1];
          vWH[0]._6_2_ = 0;
          vE[0] = uVar68;
          vF[1] = uVar17;
          vF[0] = uVar68;
          vJ[1] = uVar17;
          vJ[0]._0_6_ = 0xfffffffefffd;
          matrow0 = (int *)0xfffcfffbfffafff9;
          vJ[0]._6_2_ = 0;
          piVar9 = matrix->matrix;
          iVar1 = matrix->size;
          if (matrix->type == 0) {
            local_ae4 = (int)s2B[end_query];
          }
          else {
            if (end_query < local_ab8) {
              local_ae8 = end_query;
            }
            else {
              local_ae8 = local_ab8 + -1;
            }
            local_ae4 = local_ae8;
          }
          piVar10 = matrix->matrix;
          iVar2 = matrix->size;
          if (matrix->type == 0) {
            local_afc = (int)s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_ab8) {
              local_b00 = end_query + 1;
            }
            else {
              local_b00 = local_ab8 + -1;
            }
            local_afc = local_b00;
          }
          piVar11 = matrix->matrix;
          iVar3 = matrix->size;
          if (matrix->type == 0) {
            local_b14 = (int)s2B[end_query + 2];
          }
          else {
            if (end_query + 2 < local_ab8) {
              local_b18 = end_query + 2;
            }
            else {
              local_b18 = local_ab8 + -1;
            }
            local_b14 = local_b18;
          }
          piVar12 = matrix->matrix;
          iVar4 = matrix->size;
          if (matrix->type == 0) {
            local_b2c = (int)s2B[end_query + 3];
          }
          else {
            if (end_query + 3 < local_ab8) {
              local_b30 = end_query + 3;
            }
            else {
              local_b30 = local_ab8 + -1;
            }
            local_b2c = local_b30;
          }
          piVar13 = matrix->matrix;
          iVar5 = matrix->size;
          if (matrix->type == 0) {
            local_b44 = (int)s2B[end_query + 4];
          }
          else {
            if (end_query + 4 < local_ab8) {
              local_b48 = end_query + 4;
            }
            else {
              local_b48 = local_ab8 + -1;
            }
            local_b44 = local_b48;
          }
          piVar14 = matrix->matrix;
          iVar6 = matrix->size;
          if (matrix->type == 0) {
            local_b5c = (int)s2B[end_query + 5];
          }
          else {
            if (end_query + 5 < local_ab8) {
              local_b60 = end_query + 5;
            }
            else {
              local_b60 = local_ab8 + -1;
            }
            local_b5c = local_b60;
          }
          piVar15 = matrix->matrix;
          iVar7 = matrix->size;
          if (matrix->type == 0) {
            local_b74 = (int)s2B[end_query + 6];
          }
          else {
            if (end_query + 6 < local_ab8) {
              local_b78 = end_query + 6;
            }
            else {
              local_b78 = local_ab8 + -1;
            }
            local_b74 = local_b78;
          }
          piVar16 = matrix->matrix;
          iVar8 = matrix->size;
          if (matrix->type == 0) {
            local_b8c = (int)s2B[end_query + 7];
          }
          else {
            if (end_query + 7 < local_ab8) {
              local_b90 = end_query + 7;
            }
            else {
              local_b90 = local_ab8 + -1;
            }
            local_b8c = local_b90;
          }
          sStack_110 = (short)vILimit[0];
          sStack_10e = (short)((ulong)vILimit[0] >> 0x10);
          sStack_10c = (short)((ulong)vILimit[0] >> 0x20);
          sStack_10a = (short)((ulong)vILimit[0] >> 0x30);
          local_128 = (short)vJreset[1];
          sStack_126 = vJreset[1]._2_2_;
          sStack_124 = vJreset[1]._4_2_;
          sStack_122 = vJreset[1]._6_2_;
          sStack_120 = (short)vJreset[2];
          sStack_11e = vJreset[2]._2_2_;
          sStack_11c = vJreset[2]._4_2_;
          sStack_11a = vJreset[2]._6_2_;
          vE[1]._0_2_ = sVar44;
          vE[1]._2_2_ = sVar44;
          vE[1]._4_2_ = sVar44;
          vE[1]._6_2_ = sVar44;
          vWH[0]._0_2_ = sVar44;
          vWH[0]._2_2_ = sVar44;
          vWH[0]._4_2_ = sVar44;
          for (end_ref = 0; auVar80 = stack0xfffffffffffff688, auVar52 = stack0xfffffffffffff658,
              end_ref < s2Len + 7; end_ref = end_ref + 1) {
            Var22 = CONCAT28((short)vWH[0],
                             CONCAT26(vE[1]._6_2_,
                                      CONCAT24(vE[1]._4_2_,CONCAT22(vE[1]._2_2_,(short)vE[1]))));
            auVar79._10_2_ = vWH[0]._2_2_;
            auVar79._0_10_ = Var22;
            auVar79._12_2_ = vWH[0]._4_2_;
            auVar79._14_2_ = vWH[0]._6_2_;
            stack0xfffffffffffff688 = auVar79._2_14_;
            vNH[0]._6_2_ = ptr_00[(long)end_ref + 7];
            auVar29 = stack0xfffffffffffff688;
            stack0xfffffffffffff658 = vJ._10_14_;
            vF[0]._6_2_ = ptr_01[(long)end_ref + 7];
            auVar79 = stack0xfffffffffffff658;
            vWH[1] = (longlong)((unkuint10)Var22 >> 0x10);
            vNH[0] = auVar29._8_8_;
            auVar28._8_8_ = vNH[0];
            auVar28._0_8_ = vWH[1];
            auVar27._8_8_ = uVar20;
            auVar27._0_8_ = uVar18;
            auVar78 = psubsw(auVar28,auVar27);
            vJ[1] = auVar52._2_8_;
            vF[0] = auVar79._8_8_;
            auVar26._8_8_ = vF[0];
            auVar26._0_8_ = vJ[1];
            auVar25._8_8_ = uVar21;
            auVar25._0_8_ = uVar19;
            auVar52 = psubsw(auVar26,auVar25);
            local_488 = auVar78._0_2_;
            sStack_486 = auVar78._2_2_;
            sStack_484 = auVar78._4_2_;
            sStack_482 = auVar78._6_2_;
            sStack_480 = auVar78._8_2_;
            sStack_47e = auVar78._10_2_;
            sStack_47c = auVar78._12_2_;
            sStack_47a = auVar78._14_2_;
            local_498 = auVar52._0_2_;
            sStack_496 = auVar52._2_2_;
            sStack_494 = auVar52._4_2_;
            sStack_492 = auVar52._6_2_;
            sStack_490 = auVar52._8_2_;
            sStack_48e = auVar52._10_2_;
            sStack_48c = auVar52._12_2_;
            sStack_48a = auVar52._14_2_;
            uVar46 = (ushort)(local_488 < local_498) * local_498 |
                     (ushort)(local_488 >= local_498) * local_488;
            uVar53 = (ushort)(sStack_486 < sStack_496) * sStack_496 |
                     (ushort)(sStack_486 >= sStack_496) * sStack_486;
            uVar56 = (ushort)(sStack_484 < sStack_494) * sStack_494 |
                     (ushort)(sStack_484 >= sStack_494) * sStack_484;
            uVar59 = (ushort)(sStack_482 < sStack_492) * sStack_492 |
                     (ushort)(sStack_482 >= sStack_492) * sStack_482;
            uVar62 = (ushort)(sStack_480 < sStack_490) * sStack_490 |
                     (ushort)(sStack_480 >= sStack_490) * sStack_480;
            uVar69 = (ushort)(sStack_47e < sStack_48e) * sStack_48e |
                     (ushort)(sStack_47e >= sStack_48e) * sStack_47e;
            uVar72 = (ushort)(sStack_47c < sStack_48c) * sStack_48c |
                     (ushort)(sStack_47c >= sStack_48c) * sStack_47c;
            uVar75 = (ushort)(sStack_47a < sStack_48a) * sStack_48a |
                     (ushort)(sStack_47a >= sStack_48a) * sStack_47a;
            vJ[1] = CONCAT26(uVar59,CONCAT24(uVar56,CONCAT22(uVar53,uVar46)));
            vF[0]._0_2_ = uVar62;
            vF[0]._2_2_ = uVar69;
            vF[0]._4_2_ = uVar72;
            vF[0]._6_2_ = uVar75;
            auVar24._2_2_ = vE[1]._2_2_;
            auVar24._0_2_ = (short)vE[1];
            auVar24._4_2_ = vE[1]._4_2_;
            auVar24._6_2_ = vE[1]._6_2_;
            auVar24._10_2_ = vWH[0]._2_2_;
            auVar24._8_2_ = (short)vWH[0];
            auVar24._12_2_ = vWH[0]._4_2_;
            auVar24._14_2_ = vWH[0]._6_2_;
            auVar78._8_8_ = uVar20;
            auVar78._0_8_ = uVar18;
            auVar79 = psubsw(auVar24,auVar78);
            auVar52._8_8_ = uVar21;
            auVar52._0_8_ = uVar19;
            auVar52 = psubsw(stack0xfffffffffffff668,auVar52);
            local_4a8 = auVar79._0_2_;
            sStack_4a6 = auVar79._2_2_;
            sStack_4a4 = auVar79._4_2_;
            sStack_4a2 = auVar79._6_2_;
            sStack_4a0 = auVar79._8_2_;
            sStack_49e = auVar79._10_2_;
            sStack_49c = auVar79._12_2_;
            sStack_49a = auVar79._14_2_;
            local_4b8 = auVar52._0_2_;
            sStack_4b6 = auVar52._2_2_;
            sStack_4b4 = auVar52._4_2_;
            sStack_4b2 = auVar52._6_2_;
            sStack_4b0 = auVar52._8_2_;
            sStack_4ae = auVar52._10_2_;
            sStack_4ac = auVar52._12_2_;
            sStack_4aa = auVar52._14_2_;
            uVar47 = (ushort)(local_4a8 < local_4b8) * local_4b8 |
                     (ushort)(local_4a8 >= local_4b8) * local_4a8;
            uVar54 = (ushort)(sStack_4a6 < sStack_4b6) * sStack_4b6 |
                     (ushort)(sStack_4a6 >= sStack_4b6) * sStack_4a6;
            uVar57 = (ushort)(sStack_4a4 < sStack_4b4) * sStack_4b4 |
                     (ushort)(sStack_4a4 >= sStack_4b4) * sStack_4a4;
            uVar60 = (ushort)(sStack_4a2 < sStack_4b2) * sStack_4b2 |
                     (ushort)(sStack_4a2 >= sStack_4b2) * sStack_4a2;
            uVar63 = (ushort)(sStack_4a0 < sStack_4b0) * sStack_4b0 |
                     (ushort)(sStack_4a0 >= sStack_4b0) * sStack_4a0;
            uVar70 = (ushort)(sStack_49e < sStack_4ae) * sStack_4ae |
                     (ushort)(sStack_49e >= sStack_4ae) * sStack_49e;
            uVar73 = (ushort)(sStack_49c < sStack_4ac) * sStack_4ac |
                     (ushort)(sStack_49c >= sStack_4ac) * sStack_49c;
            uVar76 = (ushort)(sStack_49a < sStack_4aa) * sStack_4aa |
                     (ushort)(sStack_49a >= sStack_4aa) * sStack_49a;
            vF[1] = CONCAT26(uVar60,CONCAT24(uVar57,CONCAT22(uVar54,uVar47)));
            vE[0]._0_2_ = uVar63;
            vE[0]._2_2_ = uVar70;
            vE[0]._4_2_ = uVar73;
            vE[0]._6_2_ = uVar76;
            auVar31._2_2_ =
                 (short)piVar15[(long)(iVar7 * local_b74) + (long)ptr[(long)(end_ref + -6) + 7]];
            auVar31._0_2_ =
                 (short)piVar16[(long)(iVar8 * local_b8c) + (long)ptr[(long)(end_ref + -7) + 7]];
            auVar31._4_2_ =
                 (short)piVar14[(long)(iVar6 * local_b5c) + (long)ptr[(long)(end_ref + -5) + 7]];
            auVar31._6_2_ =
                 (short)piVar13[(long)(iVar5 * local_b44) + (long)ptr[(long)(end_ref + -4) + 7]];
            auVar31._10_2_ =
                 (short)piVar11[(long)(iVar3 * local_b14) + (long)ptr[(long)(end_ref + -2) + 7]];
            auVar31._8_2_ =
                 (short)piVar12[(long)(iVar4 * local_b2c) + (long)ptr[(long)(end_ref + -3) + 7]];
            auVar31._12_2_ =
                 (short)piVar10[(long)(iVar2 * local_afc) + (long)ptr[(long)(end_ref + -1) + 7]];
            auVar31._14_2_ = (short)piVar9[(long)(iVar1 * local_ae4) + (long)ptr[(long)end_ref + 7]]
            ;
            auVar52 = paddsw(auVar80,auVar31);
            local_4c8 = auVar52._0_2_;
            sStack_4c6 = auVar52._2_2_;
            sStack_4c4 = auVar52._4_2_;
            sStack_4c2 = auVar52._6_2_;
            sStack_4c0 = auVar52._8_2_;
            sStack_4be = auVar52._10_2_;
            sStack_4bc = auVar52._12_2_;
            sStack_4ba = auVar52._14_2_;
            uVar47 = (local_4c8 < (short)uVar47) * uVar47 |
                     (ushort)(local_4c8 >= (short)uVar47) * local_4c8;
            uVar54 = (sStack_4c6 < (short)uVar54) * uVar54 |
                     (ushort)(sStack_4c6 >= (short)uVar54) * sStack_4c6;
            uVar57 = (sStack_4c4 < (short)uVar57) * uVar57 |
                     (ushort)(sStack_4c4 >= (short)uVar57) * sStack_4c4;
            uVar60 = (sStack_4c2 < (short)uVar60) * uVar60 |
                     (ushort)(sStack_4c2 >= (short)uVar60) * sStack_4c2;
            uVar63 = (sStack_4c0 < (short)uVar63) * uVar63 |
                     (ushort)(sStack_4c0 >= (short)uVar63) * sStack_4c0;
            uVar70 = (sStack_4be < (short)uVar70) * uVar70 |
                     (ushort)(sStack_4be >= (short)uVar70) * sStack_4be;
            uVar73 = (sStack_4bc < (short)uVar73) * uVar73 |
                     (ushort)(sStack_4bc >= (short)uVar73) * sStack_4bc;
            uVar76 = (sStack_4ba < (short)uVar76) * uVar76 |
                     (ushort)(sStack_4ba >= (short)uVar76) * sStack_4ba;
            uVar46 = ((short)uVar47 < (short)uVar46) * uVar46 |
                     ((short)uVar47 >= (short)uVar46) * uVar47;
            uVar47 = ((short)uVar54 < (short)uVar53) * uVar53 |
                     ((short)uVar54 >= (short)uVar53) * uVar54;
            uVar53 = ((short)uVar57 < (short)uVar56) * uVar56 |
                     ((short)uVar57 >= (short)uVar56) * uVar57;
            uVar54 = ((short)uVar60 < (short)uVar59) * uVar59 |
                     ((short)uVar60 >= (short)uVar59) * uVar60;
            uVar56 = ((short)uVar63 < (short)uVar62) * uVar62 |
                     ((short)uVar63 >= (short)uVar62) * uVar63;
            uVar57 = ((short)uVar70 < (short)uVar69) * uVar69 |
                     ((short)uVar70 >= (short)uVar69) * uVar70;
            uVar59 = ((short)uVar73 < (short)uVar72) * uVar72 |
                     ((short)uVar73 >= (short)uVar72) * uVar73;
            uVar60 = ((short)uVar76 < (short)uVar75) * uVar75 |
                     ((short)uVar76 >= (short)uVar75) * uVar76;
            local_368 = (short)matrow0;
            sStack_366 = matrow0._2_2_;
            sStack_364 = matrow0._4_2_;
            sStack_362 = matrow0._6_2_;
            sStack_360 = matrow0._8_2_;
            sStack_35e = matrow0._10_2_;
            sStack_35c = matrow0._12_2_;
            sStack_35a = matrow0._14_2_;
            sVar48 = -(ushort)(local_368 == -1);
            sVar55 = -(ushort)(sStack_366 == -1);
            sVar58 = -(ushort)(sStack_364 == -1);
            sVar61 = -(ushort)(sStack_362 == -1);
            sVar64 = -(ushort)(sStack_360 == -1);
            sVar71 = -(ushort)(sStack_35e == -1);
            sVar74 = -(ushort)(sStack_35c == -1);
            sVar77 = -(ushort)(sStack_35a == -1);
            uVar49 = CONCAT22((-1 < (short)uVar47) * uVar47,(-1 < (short)uVar46) * uVar46);
            uVar65 = CONCAT22((-1 < (short)uVar57) * uVar57,(-1 < (short)uVar56) * uVar56);
            uStack_344 = (uint)(CONCAT26(sVar61,CONCAT24(sVar58,CONCAT22(sVar55,sVar48))) >> 0x20);
            uStack_33c = (uint)(CONCAT26(sVar77,CONCAT24(sVar74,CONCAT22(sVar71,sVar64))) >> 0x20);
            uStack_354 = (uint)(CONCAT26((-1 < (short)uVar54) * uVar54,
                                         CONCAT24((-1 < (short)uVar53) * uVar53,uVar49)) >> 0x20);
            uStack_34c = (uint)(CONCAT26((-1 < (short)uVar60) * uVar60,
                                         CONCAT24((-1 < (short)uVar59) * uVar59,uVar65)) >> 0x20);
            uVar49 = (CONCAT22(sVar55,sVar48) ^ 0xffffffff) & uVar49;
            uStack_354 = (uStack_344 ^ 0xffffffff) & uStack_354;
            uVar65 = (CONCAT22(sVar71,sVar64) ^ 0xffffffff) & uVar65;
            uStack_34c = (uStack_33c ^ 0xffffffff) & uStack_34c;
            vE[1]._0_2_ = (short)uVar49;
            vE[1]._2_2_ = (short)(uVar49 >> 0x10);
            vE[1]._4_2_ = (short)uStack_354;
            vE[1]._6_2_ = (short)(uStack_354 >> 0x10);
            vWH[0]._0_2_ = (short)uVar65;
            vWH[0]._2_2_ = (short)(uVar65 >> 0x10);
            vWH[0]._4_2_ = (short)uStack_34c;
            vWH[0]._6_2_ = (short)(uStack_34c >> 0x10);
            auVar40._2_2_ = sVar55;
            auVar40._0_2_ = sVar48;
            auVar40._4_2_ = sVar58;
            auVar40._6_2_ = sVar61;
            auVar40._10_2_ = sVar71;
            auVar40._8_2_ = sVar64;
            auVar40._12_2_ = sVar74;
            auVar40._14_2_ = sVar77;
            auVar42._8_8_ = vF[0];
            auVar42._0_8_ = vJ[1];
            auVar41._8_8_ = uVar68;
            auVar41._0_8_ = uVar17;
            register0x00001240 = pblendvb(auVar42,auVar41,auVar40);
            auVar80._2_2_ = sVar55;
            auVar80._0_2_ = sVar48;
            auVar80._4_2_ = sVar58;
            auVar80._6_2_ = sVar61;
            auVar80._10_2_ = sVar71;
            auVar80._8_2_ = sVar64;
            auVar80._12_2_ = sVar74;
            auVar80._14_2_ = sVar77;
            auVar39._8_8_ = vE[0];
            auVar39._0_8_ = vF[1];
            auVar38._8_8_ = uVar68;
            auVar38._0_8_ = uVar17;
            register0x00001240 = pblendvb(auVar39,auVar38,auVar80);
            if (7 < end_ref) {
              local_1d8 = (short)vSaturationCheckMax[1];
              sStack_1d6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_1d4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_1d2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_1d0 = (short)vSaturationCheckMin[0];
              sStack_1ce = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_1cc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_1ca = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              vSaturationCheckMax[1] =
                   CONCAT26((ushort)(vE[1]._6_2_ < sStack_1d2) * vE[1]._6_2_ |
                            (ushort)(vE[1]._6_2_ >= sStack_1d2) * sStack_1d2,
                            CONCAT24((ushort)(vE[1]._4_2_ < sStack_1d4) * vE[1]._4_2_ |
                                     (ushort)(vE[1]._4_2_ >= sStack_1d4) * sStack_1d4,
                                     CONCAT22((ushort)(vE[1]._2_2_ < sStack_1d6) * vE[1]._2_2_ |
                                              (ushort)(vE[1]._2_2_ >= sStack_1d6) * sStack_1d6,
                                              (ushort)((short)vE[1] < local_1d8) * (short)vE[1] |
                                              (ushort)((short)vE[1] >= local_1d8) * local_1d8)));
              vSaturationCheckMin[0] =
                   CONCAT26((ushort)(vWH[0]._6_2_ < sStack_1ca) * vWH[0]._6_2_ |
                            (ushort)(vWH[0]._6_2_ >= sStack_1ca) * sStack_1ca,
                            CONCAT24((ushort)(vWH[0]._4_2_ < sStack_1cc) * vWH[0]._4_2_ |
                                     (ushort)(vWH[0]._4_2_ >= sStack_1cc) * sStack_1cc,
                                     CONCAT22((ushort)(vWH[0]._2_2_ < sStack_1ce) * vWH[0]._2_2_ |
                                              (ushort)(vWH[0]._2_2_ >= sStack_1ce) * sStack_1ce,
                                              (ushort)((short)vWH[0] < sStack_1d0) * (short)vWH[0] |
                                              (ushort)((short)vWH[0] >= sStack_1d0) * sStack_1d0)));
              local_528 = (short)vNegInf[1];
              sStack_526 = (short)((ulong)vNegInf[1] >> 0x10);
              sStack_524 = (short)((ulong)vNegInf[1] >> 0x20);
              sStack_522 = (short)((ulong)vNegInf[1] >> 0x30);
              sStack_520 = (short)vSaturationCheckMax[0];
              sStack_51e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_51c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_51a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              vNegInf[1] = CONCAT26((ushort)(sStack_522 < vE[1]._6_2_) * vE[1]._6_2_ |
                                    (ushort)(sStack_522 >= vE[1]._6_2_) * sStack_522,
                                    CONCAT24((ushort)(sStack_524 < vE[1]._4_2_) * vE[1]._4_2_ |
                                             (ushort)(sStack_524 >= vE[1]._4_2_) * sStack_524,
                                             CONCAT22((ushort)(sStack_526 < vE[1]._2_2_) *
                                                      vE[1]._2_2_ |
                                                      (ushort)(sStack_526 >= vE[1]._2_2_) *
                                                      sStack_526,
                                                      (ushort)(local_528 < (short)vE[1]) *
                                                      (short)vE[1] |
                                                      (ushort)(local_528 >= (short)vE[1]) *
                                                      local_528)));
              vSaturationCheckMax[0] =
                   CONCAT26((ushort)(sStack_51a < vWH[0]._6_2_) * vWH[0]._6_2_ |
                            (ushort)(sStack_51a >= vWH[0]._6_2_) * sStack_51a,
                            CONCAT24((ushort)(sStack_51c < vWH[0]._4_2_) * vWH[0]._4_2_ |
                                     (ushort)(sStack_51c >= vWH[0]._4_2_) * sStack_51c,
                                     CONCAT22((ushort)(sStack_51e < vWH[0]._2_2_) * vWH[0]._2_2_ |
                                              (ushort)(sStack_51e >= vWH[0]._2_2_) * sStack_51e,
                                              (ushort)(sStack_520 < (short)vWH[0]) * (short)vWH[0] |
                                              (ushort)(sStack_520 >= (short)vWH[0]) * sStack_520)));
            }
            ptr_00[(long)(end_ref + -7) + 7] = (short)vE[1];
            ptr_01[(long)(end_ref + -7) + 7] = (int16_t)vJ[1];
            uVar50 = CONCAT26(-(ushort)(-1 < sStack_362),
                              CONCAT24(-(ushort)(-1 < sStack_364),
                                       CONCAT22(-(ushort)(-1 < sStack_366),-(ushort)(-1 < local_368)
                                               ))) &
                     CONCAT26(-(ushort)(sStack_362 < (short)gap_local),
                              CONCAT24(-(ushort)(sStack_364 < (short)gap_local),
                                       CONCAT22(-(ushort)(sStack_366 < (short)gap_local),
                                                -(ushort)(local_368 < (short)gap_local)))) &
                     CONCAT26(-(ushort)(sStack_122 < (short)s2Len_PAD),
                              CONCAT24(-(ushort)(sStack_124 < (short)s2Len_PAD),
                                       CONCAT22(-(ushort)(sStack_126 < (short)s2Len_PAD),
                                                -(ushort)(local_128 < (short)s2Len_PAD))));
            uVar66 = CONCAT26(-(ushort)(-1 < sStack_35a),
                              CONCAT24(-(ushort)(-1 < sStack_35c),
                                       CONCAT22(-(ushort)(-1 < sStack_35e),
                                                -(ushort)(-1 < sStack_360)))) &
                     CONCAT26(-(ushort)(sStack_35a < (short)gap_local),
                              CONCAT24(-(ushort)(sStack_35c < (short)gap_local),
                                       CONCAT22(-(ushort)(sStack_35e < (short)gap_local),
                                                -(ushort)(sStack_360 < (short)gap_local)))) &
                     CONCAT26(-(ushort)(sStack_11a < sStack_10a),
                              CONCAT24(-(ushort)(sStack_11c < sStack_10c),
                                       CONCAT22(-(ushort)(sStack_11e < sStack_10e),
                                                -(ushort)(sStack_120 < sStack_110))));
            local_398 = (short)vEndI[1];
            sStack_396 = vEndI[1]._2_2_;
            sStack_394 = vEndI[1]._4_2_;
            sStack_392 = vEndI[1]._6_2_;
            sStack_390 = (short)vEndI[2];
            sStack_38e = vEndI[2]._2_2_;
            sStack_38c = vEndI[2]._4_2_;
            sStack_38a = vEndI[2]._6_2_;
            uVar51 = CONCAT26(-(ushort)(sStack_392 < vE[1]._6_2_),
                              CONCAT24(-(ushort)(sStack_394 < vE[1]._4_2_),
                                       CONCAT22(-(ushort)(sStack_396 < vE[1]._2_2_),
                                                -(ushort)(local_398 < (short)vE[1])))) & uVar50;
            uVar67 = CONCAT26(-(ushort)(sStack_38a < vWH[0]._6_2_),
                              CONCAT24(-(ushort)(sStack_38c < vWH[0]._4_2_),
                                       CONCAT22(-(ushort)(sStack_38e < vWH[0]._2_2_),
                                                -(ushort)(sStack_390 < (short)vWH[0])))) & uVar66;
            local_d8 = (short)vILimit[1];
            sStack_d6 = vILimit[1]._2_2_;
            sStack_d4 = vILimit[1]._4_2_;
            sStack_d2 = vILimit[1]._6_2_;
            sStack_d0 = (short)vILimit[2];
            sStack_ce = vILimit[2]._2_2_;
            sStack_cc = vILimit[2]._4_2_;
            sStack_ca = vILimit[2]._6_2_;
            auVar37._4_2_ = vE[1]._4_2_;
            auVar37._0_4_ = uVar49;
            auVar37._6_2_ = vE[1]._6_2_;
            auVar37._12_2_ = vWH[0]._4_2_;
            auVar37._8_4_ = uVar65;
            auVar37._14_2_ = vWH[0]._6_2_;
            auVar36._8_8_ = uVar67;
            auVar36._0_8_ = uVar51;
            register0x00001240 = pblendvb(stack0xfffffffffffff6d8,auVar37,auVar36);
            auVar35._8_8_ = uVar67;
            auVar35._0_8_ = uVar51;
            auVar52 = pblendvb(stack0xfffffffffffff6c8,stack0xfffffffffffff6f8,auVar35);
            auVar34._8_8_ = uVar67;
            auVar34._0_8_ = uVar51;
            auVar80 = pblendvb(stack0xfffffffffffff6b8,_matrow0,auVar34);
            uVar50 = CONCAT26(-(ushort)(sStack_362 < sStack_d2),
                              CONCAT24(-(ushort)(sStack_364 < sStack_d4),
                                       CONCAT22(-(ushort)(sStack_366 < sStack_d6),
                                                -(ushort)(local_368 < local_d8)))) &
                     CONCAT26(-(ushort)(vE[1]._6_2_ == sStack_392),
                              CONCAT24(-(ushort)(vE[1]._4_2_ == sStack_394),
                                       CONCAT22(-(ushort)(vE[1]._2_2_ == sStack_396),
                                                -(ushort)((short)vE[1] == local_398)))) & uVar50;
            uVar66 = CONCAT26(-(ushort)(sStack_35a < sStack_ca),
                              CONCAT24(-(ushort)(sStack_35c < sStack_cc),
                                       CONCAT22(-(ushort)(sStack_35e < sStack_ce),
                                                -(ushort)(sStack_360 < sStack_d0)))) &
                     CONCAT26(-(ushort)(vWH[0]._6_2_ == sStack_38a),
                              CONCAT24(-(ushort)(vWH[0]._4_2_ == sStack_38c),
                                       CONCAT22(-(ushort)(vWH[0]._2_2_ == sStack_38e),
                                                -(ushort)((short)vWH[0] == sStack_390)))) & uVar66;
            auVar33._8_8_ = uVar66;
            auVar33._0_8_ = uVar50;
            register0x00001240 = pblendvb(auVar52,stack0xfffffffffffff6f8,auVar33);
            auVar32._8_8_ = uVar66;
            auVar32._0_8_ = uVar50;
            register0x00001240 = pblendvb(auVar80,_matrow0,auVar32);
            auVar30._8_8_ = 0x1000100010001;
            auVar30._0_8_ = 0x1000100010001;
            _matrow0 = paddsw(_matrow0,auVar30);
            unique0x10003b8e = auVar29;
          }
          auVar29._8_8_ = 0x8000800080008;
          auVar29._0_8_ = 0x8000800080008;
          register0x00001200 = paddsw(stack0xfffffffffffff6f8,auVar29);
        }
        i_1 = (int16_t *)(vEndI + 1);
        j_1 = (int16_t *)(vEndJ + 1);
        plStack_ab0 = vILimit + 1;
        local_82e = sVar44;
        for (local_ab4 = 0; local_ab4 < 8; local_ab4 = local_ab4 + 1) {
          if (local_82e < *i_1) {
            local_82e = *i_1;
            _POS_LIMIT = (int)*j_1;
            iStack_828 = (int)(short)*plStack_ab0;
          }
          else if (*i_1 == local_82e) {
            if ((short)*plStack_ab0 < iStack_828) {
              _POS_LIMIT = (int)*j_1;
              iStack_828 = (int)(short)*plStack_ab0;
            }
            else if (((short)*plStack_ab0 == iStack_828) && (*j_1 < _POS_LIMIT)) {
              _POS_LIMIT = (int)*j_1;
              iStack_828 = (int)(short)*plStack_ab0;
            }
          }
          i_1 = i_1 + 1;
          j_1 = j_1 + 1;
          plStack_ab0 = (longlong *)((long)plStack_ab0 + 2);
        }
        local_c8 = (short)vSaturationCheckMax[1];
        sStack_c6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_c4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_c2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_c0 = (short)vSaturationCheckMin[0];
        sStack_be = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_bc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_ba = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_98 = (short)vNegInf[1];
        sStack_96 = (short)((ulong)vNegInf[1] >> 0x10);
        sStack_94 = (short)((ulong)vNegInf[1] >> 0x20);
        sStack_92 = (short)((ulong)vNegInf[1] >> 0x30);
        sStack_90 = (short)vSaturationCheckMax[0];
        sStack_8e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_8c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_8a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar68 = CONCAT26(-(ushort)(sStack_ba < sVar44),
                          CONCAT24(-(ushort)(sStack_bc < sVar44),
                                   CONCAT22(-(ushort)(sStack_be < sVar44),
                                            -(ushort)(sStack_c0 < sVar44)))) |
                 CONCAT26(-(ushort)(sVar45 < sStack_8a),
                          CONCAT24(-(ushort)(sVar45 < sStack_8c),
                                   CONCAT22(-(ushort)(sVar45 < sStack_8e),
                                            -(ushort)(sVar45 < sStack_90))));
        auVar43._8_8_ = uVar68;
        auVar43._0_8_ =
             CONCAT26(-(ushort)(sStack_c2 < sVar44),
                      CONCAT24(-(ushort)(sStack_c4 < sVar44),
                               CONCAT22(-(ushort)(sStack_c6 < sVar44),-(ushort)(local_c8 < sVar44)))
                     ) |
             CONCAT26(-(ushort)(sVar45 < sStack_92),
                      CONCAT24(-(ushort)(sVar45 < sStack_94),
                               CONCAT22(-(ushort)(sVar45 < sStack_96),-(ushort)(sVar45 < local_98)))
                     );
        if ((((((((((((((((auVar43 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar43 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar43 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar43 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar43 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar43 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar68 >> 7 & 1) != 0) || (uVar68 >> 0xf & 1) != 0) || (uVar68 >> 0x17 & 1) != 0)
               || (uVar68 >> 0x1f & 1) != 0) || (uVar68 >> 0x27 & 1) != 0) ||
             (uVar68 >> 0x2f & 1) != 0) || (uVar68 >> 0x37 & 1) != 0) || (long)uVar68 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          local_82e = 0;
          _POS_LIMIT = 0;
          iStack_828 = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)local_82e;
        ((parasail_result_t *)_s1_local)->end_query = _POS_LIMIT;
        ((parasail_result_t *)_s1_local)->end_ref = iStack_828;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vJLimit = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            vWH = _mm_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi16(vJ, vNegOne),
                        _mm_cmplt_epi16(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi16(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi16(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi16(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}